

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample03.cpp
# Opt level: O0

Person * __thiscall Person::GetName_abi_cxx11_(Person *this)

{
  string *in_RSI;
  Person *this_local;
  
  std::__cxx11::string::string((string *)this,in_RSI);
  return this;
}

Assistant:

std::string GetName() const { return m_name; }